

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::LE_EulerAngles::Decode(LE_EulerAngles *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (2 < KVar1) {
    (*(this->m_Psi).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Psi,stream);
    (*(this->m_Theta).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Theta,stream);
    (*(this->m_Phi).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Phi,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LE_EulerAngles::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LE_EULER_ANGLES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_Psi
           >> KDIS_STREAM m_Theta
           >> KDIS_STREAM m_Phi;
}